

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_get_builtin_mime_type(char *path)

{
  int iVar1;
  size_t sVar2;
  size_t path_len;
  size_t i;
  char *ext;
  char *path_local;
  
  sVar2 = strlen(path);
  path_len = 0;
  while( true ) {
    if (builtin_mime_types[path_len].extension == (char *)0x0) {
      return "text/plain";
    }
    if ((builtin_mime_types[path_len].ext_len < sVar2) &&
       (iVar1 = mg_strcasecmp(path + (sVar2 - builtin_mime_types[path_len].ext_len),
                              builtin_mime_types[path_len].extension), iVar1 == 0)) break;
    path_len = path_len + 1;
  }
  return builtin_mime_types[path_len].mime_type;
}

Assistant:

CIVETWEB_API const char *
mg_get_builtin_mime_type(const char *path)
{
	const char *ext;
	size_t i, path_len;

	path_len = strlen(path);

	for (i = 0; builtin_mime_types[i].extension != NULL; i++) {
		ext = path + (path_len - builtin_mime_types[i].ext_len);
		if ((path_len > builtin_mime_types[i].ext_len)
		    && (mg_strcasecmp(ext, builtin_mime_types[i].extension) == 0)) {
			return builtin_mime_types[i].mime_type;
		}
	}

	return "text/plain";
}